

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::
     BVHNIntersector1<8,_1,_false,_embree::avx::ArrayIntersector1<embree::avx::QuadMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  ulong uVar4;
  float **ppfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [32];
  undefined4 uVar85;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  uint uVar100;
  undefined1 (*pauVar101) [16];
  long lVar102;
  uint uVar103;
  ulong uVar104;
  long lVar105;
  ulong uVar106;
  long lVar107;
  Scene *pSVar108;
  ulong uVar109;
  ulong uVar110;
  ulong uVar111;
  undefined1 (*pauVar112) [16];
  ulong uVar113;
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [64];
  undefined1 auVar118 [16];
  undefined1 auVar120 [32];
  undefined1 auVar119 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  float fVar130;
  float fVar131;
  undefined1 auVar127 [16];
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar141 [32];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [64];
  float fVar153;
  undefined1 auVar154 [32];
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  undefined1 auVar155 [64];
  undefined1 auVar162 [32];
  uint uVar164;
  uint uVar165;
  uint uVar166;
  uint uVar167;
  uint uVar168;
  uint uVar169;
  undefined1 auVar163 [64];
  undefined1 auVar170 [32];
  undefined1 auVar171 [64];
  undefined1 auVar172 [64];
  float fVar173;
  undefined1 auVar174 [32];
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar175 [64];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  undefined1 auVar184 [32];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_280c;
  RayQueryContext *local_2808;
  undefined1 local_2800 [40];
  Geometry *local_27d8;
  ulong local_27d0;
  long local_27c8;
  RTCFilterFunctionNArguments local_27c0;
  float local_2790;
  float local_278c;
  float local_2788;
  float local_2784;
  float local_2780;
  undefined4 local_277c;
  uint local_2778;
  uint local_2774;
  uint local_2770;
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  undefined1 local_2600 [32];
  undefined1 local_25c0 [32];
  float local_25a0 [4];
  float fStack_2590;
  float fStack_258c;
  float fStack_2588;
  undefined4 uStack_2584;
  float local_2580 [4];
  float fStack_2570;
  float fStack_256c;
  float fStack_2568;
  undefined4 uStack_2564;
  undefined1 local_2560 [32];
  float local_2540 [4];
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined4 uStack_2524;
  float local_2520 [4];
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  undefined4 uStack_2504;
  float local_2500 [4];
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  undefined4 uStack_24e4;
  undefined1 local_24e0 [8];
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [48];
  undefined8 local_2360 [1126];
  
  local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2808 = context;
    pauVar112 = (undefined1 (*) [16])local_2390;
    uStack_2398 = 0;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar118 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3])
                         );
    auVar127 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar140._8_4_ = 0x7fffffff;
    auVar140._0_8_ = 0x7fffffff7fffffff;
    auVar140._12_4_ = 0x7fffffff;
    auVar140 = vandps_avx((undefined1  [16])aVar3,auVar140);
    auVar144._8_4_ = 0x219392ef;
    auVar144._0_8_ = 0x219392ef219392ef;
    auVar144._12_4_ = 0x219392ef;
    auVar140 = vcmpps_avx(auVar140,auVar144,1);
    auVar140 = vblendvps_avx((undefined1  [16])aVar3,auVar144,auVar140);
    auVar144 = vrcpps_avx(auVar140);
    fVar126 = auVar144._0_4_;
    auVar136._0_4_ = auVar140._0_4_ * fVar126;
    fVar131 = auVar144._4_4_;
    auVar136._4_4_ = auVar140._4_4_ * fVar131;
    fVar132 = auVar144._8_4_;
    auVar136._8_4_ = auVar140._8_4_ * fVar132;
    fVar133 = auVar144._12_4_;
    auVar136._12_4_ = auVar140._12_4_ * fVar133;
    auVar145._8_4_ = 0x3f800000;
    auVar145._0_8_ = 0x3f8000003f800000;
    auVar145._12_4_ = 0x3f800000;
    auVar140 = vsubps_avx(auVar145,auVar136);
    uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_23e0._4_4_ = uVar1;
    local_23e0._0_4_ = uVar1;
    local_23e0._8_4_ = uVar1;
    local_23e0._12_4_ = uVar1;
    local_23e0._16_4_ = uVar1;
    local_23e0._20_4_ = uVar1;
    local_23e0._24_4_ = uVar1;
    local_23e0._28_4_ = uVar1;
    auVar152 = ZEXT3264(local_23e0);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_2400._4_4_ = uVar1;
    local_2400._0_4_ = uVar1;
    local_2400._8_4_ = uVar1;
    local_2400._12_4_ = uVar1;
    local_2400._16_4_ = uVar1;
    local_2400._20_4_ = uVar1;
    local_2400._24_4_ = uVar1;
    local_2400._28_4_ = uVar1;
    auVar155 = ZEXT3264(local_2400);
    uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_2420._4_4_ = uVar1;
    local_2420._0_4_ = uVar1;
    local_2420._8_4_ = uVar1;
    local_2420._12_4_ = uVar1;
    local_2420._16_4_ = uVar1;
    local_2420._20_4_ = uVar1;
    local_2420._24_4_ = uVar1;
    local_2420._28_4_ = uVar1;
    auVar163 = ZEXT3264(local_2420);
    auVar137._0_4_ = fVar126 + fVar126 * auVar140._0_4_;
    auVar137._4_4_ = fVar131 + fVar131 * auVar140._4_4_;
    auVar137._8_4_ = fVar132 + fVar132 * auVar140._8_4_;
    auVar137._12_4_ = fVar133 + fVar133 * auVar140._12_4_;
    auVar140 = vshufps_avx(auVar137,auVar137,0);
    local_2440._16_16_ = auVar140;
    local_2440._0_16_ = auVar140;
    auVar171 = ZEXT3264(local_2440);
    auVar140 = vmovshdup_avx(auVar137);
    auVar144 = vshufps_avx(auVar137,auVar137,0x55);
    local_2460._16_16_ = auVar144;
    local_2460._0_16_ = auVar144;
    auVar172 = ZEXT3264(local_2460);
    auVar144 = vshufpd_avx(auVar137,auVar137,1);
    auVar136 = vshufps_avx(auVar137,auVar137,0xaa);
    local_2480._16_16_ = auVar136;
    local_2480._0_16_ = auVar136;
    auVar175 = ZEXT3264(local_2480);
    uVar110 = (ulong)(auVar137._0_4_ < 0.0) << 5;
    uVar109 = (ulong)(auVar140._0_4_ < 0.0) << 5 | 0x40;
    uVar106 = (ulong)(auVar144._0_4_ < 0.0) << 5 | 0x80;
    uVar111 = uVar110 ^ 0x20;
    auVar140 = vshufps_avx(auVar118,auVar118,0);
    local_24a0._16_16_ = auVar140;
    local_24a0._0_16_ = auVar140;
    auVar183 = ZEXT3264(local_24a0);
    auVar140 = vshufps_avx(auVar127,auVar127,0);
    auVar117 = ZEXT3264(CONCAT1616(auVar140,auVar140));
    local_26a0._16_16_ = mm_lookupmask_ps._240_16_;
    local_26a0._0_16_ = mm_lookupmask_ps._240_16_;
    local_24c0 = vperm2f128_avx(local_26a0,mm_lookupmask_ps._0_32_,2);
    auVar120._8_4_ = 0xbf800000;
    auVar120._0_8_ = 0xbf800000bf800000;
    auVar120._12_4_ = 0xbf800000;
    auVar120._16_4_ = 0xbf800000;
    auVar120._20_4_ = 0xbf800000;
    auVar120._24_4_ = 0xbf800000;
    auVar120._28_4_ = 0xbf800000;
    auVar139._8_4_ = 0x3f800000;
    auVar139._0_8_ = 0x3f8000003f800000;
    auVar139._12_4_ = 0x3f800000;
    auVar139._16_4_ = 0x3f800000;
    auVar139._20_4_ = 0x3f800000;
    auVar139._24_4_ = 0x3f800000;
    auVar139._28_4_ = 0x3f800000;
    _local_24e0 = vblendvps_avx(auVar139,auVar120,local_24c0);
LAB_00e664ce:
    if (pauVar112 != (undefined1 (*) [16])&local_23a0) {
      pauVar101 = pauVar112 + -1;
      pauVar112 = pauVar112 + -1;
      if (*(float *)(*pauVar101 + 8) <= (ray->super_RayK<1>).tfar) {
        uVar104 = *(ulong *)*pauVar112;
        while ((uVar104 & 8) == 0) {
          auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + uVar110),auVar152._0_32_);
          auVar75._4_4_ = auVar171._4_4_ * auVar120._4_4_;
          auVar75._0_4_ = auVar171._0_4_ * auVar120._0_4_;
          auVar75._8_4_ = auVar171._8_4_ * auVar120._8_4_;
          auVar75._12_4_ = auVar171._12_4_ * auVar120._12_4_;
          auVar75._16_4_ = auVar171._16_4_ * auVar120._16_4_;
          auVar75._20_4_ = auVar171._20_4_ * auVar120._20_4_;
          auVar75._24_4_ = auVar171._24_4_ * auVar120._24_4_;
          auVar75._28_4_ = auVar120._28_4_;
          auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + uVar109),auVar155._0_32_);
          auVar74._4_4_ = auVar172._4_4_ * auVar120._4_4_;
          auVar74._0_4_ = auVar172._0_4_ * auVar120._0_4_;
          auVar74._8_4_ = auVar172._8_4_ * auVar120._8_4_;
          auVar74._12_4_ = auVar172._12_4_ * auVar120._12_4_;
          auVar74._16_4_ = auVar172._16_4_ * auVar120._16_4_;
          auVar74._20_4_ = auVar172._20_4_ * auVar120._20_4_;
          auVar74._24_4_ = auVar172._24_4_ * auVar120._24_4_;
          auVar74._28_4_ = auVar120._28_4_;
          auVar120 = vmaxps_avx(auVar75,auVar74);
          auVar139 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + uVar106),auVar163._0_32_);
          auVar76._4_4_ = auVar175._4_4_ * auVar139._4_4_;
          auVar76._0_4_ = auVar175._0_4_ * auVar139._0_4_;
          auVar76._8_4_ = auVar175._8_4_ * auVar139._8_4_;
          auVar76._12_4_ = auVar175._12_4_ * auVar139._12_4_;
          auVar76._16_4_ = auVar175._16_4_ * auVar139._16_4_;
          auVar76._20_4_ = auVar175._20_4_ * auVar139._20_4_;
          auVar76._24_4_ = auVar175._24_4_ * auVar139._24_4_;
          auVar76._28_4_ = auVar139._28_4_;
          auVar139 = vmaxps_avx(auVar76,auVar183._0_32_);
          local_2660 = vmaxps_avx(auVar120,auVar139);
          auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + uVar111),auVar152._0_32_);
          auVar77._4_4_ = auVar171._4_4_ * auVar120._4_4_;
          auVar77._0_4_ = auVar171._0_4_ * auVar120._0_4_;
          auVar77._8_4_ = auVar171._8_4_ * auVar120._8_4_;
          auVar77._12_4_ = auVar171._12_4_ * auVar120._12_4_;
          auVar77._16_4_ = auVar171._16_4_ * auVar120._16_4_;
          auVar77._20_4_ = auVar171._20_4_ * auVar120._20_4_;
          auVar77._24_4_ = auVar171._24_4_ * auVar120._24_4_;
          auVar77._28_4_ = auVar120._28_4_;
          auVar120 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + (uVar109 ^ 0x20)),
                                auVar155._0_32_);
          auVar78._4_4_ = auVar172._4_4_ * auVar120._4_4_;
          auVar78._0_4_ = auVar172._0_4_ * auVar120._0_4_;
          auVar78._8_4_ = auVar172._8_4_ * auVar120._8_4_;
          auVar78._12_4_ = auVar172._12_4_ * auVar120._12_4_;
          auVar78._16_4_ = auVar172._16_4_ * auVar120._16_4_;
          auVar78._20_4_ = auVar172._20_4_ * auVar120._20_4_;
          auVar78._24_4_ = auVar172._24_4_ * auVar120._24_4_;
          auVar78._28_4_ = auVar120._28_4_;
          auVar120 = vminps_avx(auVar77,auVar78);
          auVar139 = vsubps_avx(*(undefined1 (*) [32])(uVar104 + 0x40 + (uVar106 ^ 0x20)),
                                auVar163._0_32_);
          auVar79._4_4_ = auVar175._4_4_ * auVar139._4_4_;
          auVar79._0_4_ = auVar175._0_4_ * auVar139._0_4_;
          auVar79._8_4_ = auVar175._8_4_ * auVar139._8_4_;
          auVar79._12_4_ = auVar175._12_4_ * auVar139._12_4_;
          auVar79._16_4_ = auVar175._16_4_ * auVar139._16_4_;
          auVar79._20_4_ = auVar175._20_4_ * auVar139._20_4_;
          auVar79._24_4_ = auVar175._24_4_ * auVar139._24_4_;
          auVar79._28_4_ = auVar139._28_4_;
          auVar139 = vminps_avx(auVar79,auVar117._0_32_);
          auVar120 = vminps_avx(auVar120,auVar139);
          auVar120 = vcmpps_avx(local_2660,auVar120,2);
          uVar100 = vmovmskps_avx(auVar120);
          if (uVar100 == 0) goto LAB_00e664ce;
          uVar100 = uVar100 & 0xff;
          uVar113 = uVar104 & 0xfffffffffffffff0;
          lVar105 = 0;
          if (uVar100 != 0) {
            for (; (uVar100 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
            }
          }
          uVar104 = *(ulong *)(uVar113 + lVar105 * 8);
          uVar100 = uVar100 - 1 & uVar100;
          if (uVar100 != 0) {
            uVar164 = *(uint *)(local_2660 + lVar105 * 4);
            lVar105 = 0;
            if (uVar100 != 0) {
              for (; (uVar100 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
              }
            }
            uVar4 = *(ulong *)(uVar113 + lVar105 * 8);
            uVar103 = *(uint *)(local_2660 + lVar105 * 4);
            uVar100 = uVar100 - 1 & uVar100;
            if (uVar100 == 0) {
              if (uVar164 < uVar103) {
                *(ulong *)*pauVar112 = uVar4;
                *(uint *)(*pauVar112 + 8) = uVar103;
                pauVar112 = pauVar112 + 1;
              }
              else {
                *(ulong *)*pauVar112 = uVar104;
                *(uint *)(*pauVar112 + 8) = uVar164;
                pauVar112 = pauVar112 + 1;
                uVar104 = uVar4;
              }
            }
            else {
              auVar118._8_8_ = 0;
              auVar118._0_8_ = uVar104;
              auVar140 = vpunpcklqdq_avx(auVar118,ZEXT416(uVar164));
              auVar127._8_8_ = 0;
              auVar127._0_8_ = uVar4;
              auVar118 = vpunpcklqdq_avx(auVar127,ZEXT416(uVar103));
              lVar105 = 0;
              if (uVar100 != 0) {
                for (; (uVar100 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                }
              }
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)(uVar113 + lVar105 * 8);
              auVar144 = vpunpcklqdq_avx(auVar138,ZEXT416(*(uint *)(local_2660 + lVar105 * 4)));
              auVar127 = vpcmpgtd_avx(auVar118,auVar140);
              uVar100 = uVar100 - 1 & uVar100;
              if (uVar100 == 0) {
                auVar136 = vpshufd_avx(auVar127,0xaa);
                auVar127 = vblendvps_avx(auVar118,auVar140,auVar136);
                auVar140 = vblendvps_avx(auVar140,auVar118,auVar136);
                auVar118 = vpcmpgtd_avx(auVar144,auVar127);
                auVar136 = vpshufd_avx(auVar118,0xaa);
                auVar118 = vblendvps_avx(auVar144,auVar127,auVar136);
                auVar127 = vblendvps_avx(auVar127,auVar144,auVar136);
                auVar144 = vpcmpgtd_avx(auVar127,auVar140);
                auVar136 = vpshufd_avx(auVar144,0xaa);
                auVar144 = vblendvps_avx(auVar127,auVar140,auVar136);
                auVar140 = vblendvps_avx(auVar140,auVar127,auVar136);
                *pauVar112 = auVar140;
                pauVar112[1] = auVar144;
                uVar104 = auVar118._0_8_;
                pauVar112 = pauVar112 + 2;
              }
              else {
                lVar105 = 0;
                if (uVar100 != 0) {
                  for (; (uVar100 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                  }
                }
                auVar146._8_8_ = 0;
                auVar146._0_8_ = *(ulong *)(uVar113 + lVar105 * 8);
                auVar136 = vpunpcklqdq_avx(auVar146,ZEXT416(*(uint *)(local_2660 + lVar105 * 4)));
                uVar100 = uVar100 - 1 & uVar100;
                uVar104 = (ulong)uVar100;
                if (uVar100 == 0) {
                  auVar137 = vpshufd_avx(auVar127,0xaa);
                  auVar127 = vblendvps_avx(auVar118,auVar140,auVar137);
                  auVar140 = vblendvps_avx(auVar140,auVar118,auVar137);
                  auVar118 = vpcmpgtd_avx(auVar136,auVar144);
                  auVar137 = vpshufd_avx(auVar118,0xaa);
                  auVar118 = vblendvps_avx(auVar136,auVar144,auVar137);
                  auVar144 = vblendvps_avx(auVar144,auVar136,auVar137);
                  auVar136 = vpcmpgtd_avx(auVar144,auVar140);
                  auVar137 = vpshufd_avx(auVar136,0xaa);
                  auVar136 = vblendvps_avx(auVar144,auVar140,auVar137);
                  auVar140 = vblendvps_avx(auVar140,auVar144,auVar137);
                  auVar144 = vpcmpgtd_avx(auVar118,auVar127);
                  auVar137 = vpshufd_avx(auVar144,0xaa);
                  auVar144 = vblendvps_avx(auVar118,auVar127,auVar137);
                  auVar118 = vblendvps_avx(auVar127,auVar118,auVar137);
                  auVar127 = vpcmpgtd_avx(auVar136,auVar118);
                  auVar137 = vpshufd_avx(auVar127,0xaa);
                  auVar127 = vblendvps_avx(auVar136,auVar118,auVar137);
                  auVar118 = vblendvps_avx(auVar118,auVar136,auVar137);
                  *pauVar112 = auVar140;
                  pauVar112[1] = auVar118;
                  pauVar112[2] = auVar127;
                  uVar104 = auVar144._0_8_;
                  pauVar112 = pauVar112 + 3;
                }
                else {
                  *pauVar112 = auVar140;
                  pauVar112[1] = auVar118;
                  pauVar112[2] = auVar144;
                  pauVar101 = pauVar112 + 3;
                  pauVar112[3] = auVar136;
                  do {
                    lVar105 = 0;
                    if (uVar104 != 0) {
                      for (; (uVar104 >> lVar105 & 1) == 0; lVar105 = lVar105 + 1) {
                      }
                    }
                    auVar119._8_8_ = 0;
                    auVar119._0_8_ = *(ulong *)(uVar113 + lVar105 * 8);
                    auVar140 = vpunpcklqdq_avx(auVar119,ZEXT416(*(uint *)(local_2660 + lVar105 * 4))
                                              );
                    pauVar101[1] = auVar140;
                    pauVar101 = pauVar101 + 1;
                    uVar104 = uVar104 & uVar104 - 1;
                  } while (uVar104 != 0);
                  lVar105 = 0;
                  while (pauVar101 != pauVar112) {
                    auVar140 = pauVar112[1];
                    uVar100 = vextractps_avx(auVar140,2);
                    for (lVar107 = 0x10;
                        (lVar105 != lVar107 && (*(uint *)(pauVar112[-1] + lVar107 + 8) < uVar100));
                        lVar107 = lVar107 + -0x10) {
                      *(undefined1 (*) [16])(*pauVar112 + lVar107) =
                           *(undefined1 (*) [16])(pauVar112[-1] + lVar107);
                    }
                    *(undefined1 (*) [16])(*pauVar112 + lVar107) = auVar140;
                    lVar105 = lVar105 + -0x10;
                    pauVar112 = pauVar112 + 1;
                  }
                  uVar104 = *(ulong *)*pauVar101;
                  pauVar112 = pauVar101;
                }
              }
            }
          }
        }
        local_27c8 = (ulong)((uint)uVar104 & 0xf) - 8;
        uVar104 = uVar104 & 0xfffffffffffffff0;
        lVar105 = 0;
        while (lVar105 != local_27c8) {
          lVar102 = lVar105 * 0x60;
          pSVar108 = local_2808->scene;
          ppfVar5 = (pSVar108->vertices).items;
          pfVar6 = ppfVar5[*(uint *)(uVar104 + 0x40 + lVar102)];
          pfVar7 = ppfVar5[*(uint *)(uVar104 + 0x44 + lVar102)];
          pfVar8 = ppfVar5[*(uint *)(uVar104 + 0x48 + lVar102)];
          pfVar9 = ppfVar5[*(uint *)(uVar104 + 0x4c + lVar102)];
          auVar127 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar104 + lVar102)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar104 + 8 + lVar102))
                                  );
          auVar140 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar104 + lVar102)),
                                   *(undefined1 (*) [16])(pfVar8 + *(uint *)(uVar104 + 8 + lVar102))
                                  );
          auVar144 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar104 + 4 + lVar102))
                                   ,*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar104 + 0xc + lVar102)));
          auVar118 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar104 + 4 + lVar102))
                                   ,*(undefined1 (*) [16])
                                     (pfVar9 + *(uint *)(uVar104 + 0xc + lVar102)));
          auVar137 = vunpcklps_avx(auVar140,auVar118);
          auVar145 = vunpcklps_avx(auVar127,auVar144);
          auVar140 = vunpckhps_avx(auVar127,auVar144);
          auVar144 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x10 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x18 + lVar102)));
          auVar118 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x10 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x18 + lVar102)));
          auVar136 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar104 + 0x14 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar104 + 0x1c + lVar102)));
          auVar127 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar104 + 0x14 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar104 + 0x1c + lVar102)));
          auVar138 = vunpcklps_avx(auVar118,auVar127);
          auVar146 = vunpcklps_avx(auVar144,auVar136);
          auVar118 = vunpckhps_avx(auVar144,auVar136);
          auVar136 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x20 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x28 + lVar102)));
          auVar127 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x20 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x28 + lVar102)));
          auVar119 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar104 + 0x24 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar104 + 0x2c + lVar102)));
          auVar144 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar104 + 0x24 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar104 + 0x2c + lVar102)));
          auVar80 = vunpcklps_avx(auVar127,auVar144);
          auVar81 = vunpcklps_avx(auVar136,auVar119);
          auVar127 = vunpckhps_avx(auVar136,auVar119);
          auVar119 = vunpcklps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x30 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x38 + lVar102)));
          auVar144 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar6 + *(uint *)(uVar104 + 0x30 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar8 + *(uint *)(uVar104 + 0x38 + lVar102)));
          auVar82 = vunpcklps_avx(*(undefined1 (*) [16])
                                   (pfVar7 + *(uint *)(uVar104 + 0x34 + lVar102)),
                                  *(undefined1 (*) [16])
                                   (pfVar9 + *(uint *)(uVar104 + 0x3c + lVar102)));
          auVar136 = vunpckhps_avx(*(undefined1 (*) [16])
                                    (pfVar7 + *(uint *)(uVar104 + 0x34 + lVar102)),
                                   *(undefined1 (*) [16])
                                    (pfVar9 + *(uint *)(uVar104 + 0x3c + lVar102)));
          auVar136 = vunpcklps_avx(auVar144,auVar136);
          auVar83 = vunpcklps_avx(auVar119,auVar82);
          auVar144 = vunpckhps_avx(auVar119,auVar82);
          lVar107 = uVar104 + 0x40 + lVar102;
          local_23c0 = *(undefined8 *)(lVar107 + 0x10);
          uStack_23b8 = *(undefined8 *)(lVar107 + 0x18);
          uStack_23b0 = local_23c0;
          uStack_23a8 = uStack_23b8;
          lVar102 = uVar104 + 0x50 + lVar102;
          local_2680 = *(undefined8 *)(lVar102 + 0x10);
          uStack_2678 = *(undefined8 *)(lVar102 + 0x18);
          uStack_2670 = local_2680;
          uStack_2668 = uStack_2678;
          auVar141._16_16_ = auVar81;
          auVar141._0_16_ = auVar145;
          auVar147._16_16_ = auVar127;
          auVar147._0_16_ = auVar140;
          auVar151._16_16_ = auVar80;
          auVar151._0_16_ = auVar137;
          auVar121._16_16_ = auVar146;
          auVar121._0_16_ = auVar146;
          auVar148._16_16_ = auVar118;
          auVar148._0_16_ = auVar118;
          auVar128._16_16_ = auVar138;
          auVar128._0_16_ = auVar138;
          auVar162._16_16_ = auVar83;
          auVar162._0_16_ = auVar83;
          auVar170._16_16_ = auVar144;
          auVar170._0_16_ = auVar144;
          auVar114._16_16_ = auVar136;
          auVar114._0_16_ = auVar136;
          local_2800._0_32_ = vsubps_avx(auVar141,auVar121);
          auVar74 = vsubps_avx(auVar147,auVar148);
          local_26e0 = auVar74;
          auVar120 = vsubps_avx(auVar151,auVar128);
          auVar139 = vsubps_avx(auVar162,auVar141);
          auVar75 = vsubps_avx(auVar170,auVar147);
          auVar76 = vsubps_avx(auVar114,auVar151);
          fVar133 = auVar76._0_4_;
          fVar173 = auVar74._0_4_;
          fVar14 = auVar76._4_4_;
          fVar176 = auVar74._4_4_;
          auVar84._4_4_ = fVar176 * fVar14;
          auVar84._0_4_ = fVar173 * fVar133;
          fVar24 = auVar76._8_4_;
          fVar177 = auVar74._8_4_;
          auVar84._8_4_ = fVar177 * fVar24;
          fVar34 = auVar76._12_4_;
          fVar178 = auVar74._12_4_;
          auVar84._12_4_ = fVar178 * fVar34;
          fVar44 = auVar76._16_4_;
          fVar179 = auVar74._16_4_;
          auVar84._16_4_ = fVar179 * fVar44;
          fVar54 = auVar76._20_4_;
          fVar180 = auVar74._20_4_;
          auVar84._20_4_ = fVar180 * fVar54;
          fVar64 = auVar76._24_4_;
          fVar181 = auVar74._24_4_;
          auVar84._24_4_ = fVar181 * fVar64;
          auVar84._28_4_ = auVar136._12_4_;
          fVar134 = auVar75._0_4_;
          fVar153 = auVar120._0_4_;
          fVar15 = auVar75._4_4_;
          fVar156 = auVar120._4_4_;
          auVar86._4_4_ = fVar156 * fVar15;
          auVar86._0_4_ = fVar153 * fVar134;
          fVar25 = auVar75._8_4_;
          fVar157 = auVar120._8_4_;
          auVar86._8_4_ = fVar157 * fVar25;
          fVar35 = auVar75._12_4_;
          fVar158 = auVar120._12_4_;
          auVar86._12_4_ = fVar158 * fVar35;
          fVar45 = auVar75._16_4_;
          fVar159 = auVar120._16_4_;
          auVar86._16_4_ = fVar159 * fVar45;
          fVar55 = auVar75._20_4_;
          fVar160 = auVar120._20_4_;
          auVar86._20_4_ = fVar160 * fVar55;
          fVar65 = auVar75._24_4_;
          uVar85 = auVar146._12_4_;
          fVar161 = auVar120._24_4_;
          auVar86._24_4_ = fVar161 * fVar65;
          auVar86._28_4_ = uVar85;
          local_2740 = vsubps_avx(auVar86,auVar84);
          fVar135 = auVar139._0_4_;
          fVar16 = auVar139._4_4_;
          auVar87._4_4_ = fVar156 * fVar16;
          auVar87._0_4_ = fVar153 * fVar135;
          fVar26 = auVar139._8_4_;
          auVar87._8_4_ = fVar157 * fVar26;
          fVar36 = auVar139._12_4_;
          auVar87._12_4_ = fVar158 * fVar36;
          fVar46 = auVar139._16_4_;
          auVar87._16_4_ = fVar159 * fVar46;
          fVar56 = auVar139._20_4_;
          auVar87._20_4_ = fVar160 * fVar56;
          fVar66 = auVar139._24_4_;
          auVar87._24_4_ = fVar161 * fVar66;
          auVar87._28_4_ = uVar85;
          fVar142 = local_2800._0_4_;
          fVar17 = local_2800._4_4_;
          auVar88._4_4_ = fVar14 * fVar17;
          auVar88._0_4_ = fVar133 * fVar142;
          fVar27 = local_2800._8_4_;
          auVar88._8_4_ = fVar24 * fVar27;
          fVar37 = local_2800._12_4_;
          auVar88._12_4_ = fVar34 * fVar37;
          fVar47 = local_2800._16_4_;
          auVar88._16_4_ = fVar44 * fVar47;
          fVar57 = local_2800._20_4_;
          auVar88._20_4_ = fVar54 * fVar57;
          fVar67 = local_2800._24_4_;
          auVar88._24_4_ = fVar64 * fVar67;
          auVar88._28_4_ = auVar138._12_4_;
          auVar120 = vsubps_avx(auVar88,auVar87);
          auVar89._4_4_ = fVar15 * fVar17;
          auVar89._0_4_ = fVar134 * fVar142;
          auVar89._8_4_ = fVar25 * fVar27;
          auVar89._12_4_ = fVar35 * fVar37;
          auVar89._16_4_ = fVar45 * fVar47;
          auVar89._20_4_ = fVar55 * fVar57;
          auVar89._24_4_ = fVar65 * fVar67;
          auVar89._28_4_ = auVar138._12_4_;
          auVar90._4_4_ = fVar176 * fVar16;
          auVar90._0_4_ = fVar173 * fVar135;
          auVar90._8_4_ = fVar177 * fVar26;
          auVar90._12_4_ = fVar178 * fVar36;
          auVar90._16_4_ = fVar179 * fVar46;
          auVar90._20_4_ = fVar180 * fVar56;
          auVar90._24_4_ = fVar181 * fVar66;
          auVar90._28_4_ = auVar74._28_4_;
          local_2760 = vsubps_avx(auVar90,auVar89);
          uVar1 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
          auVar174._4_4_ = uVar1;
          auVar174._0_4_ = uVar1;
          auVar174._8_4_ = uVar1;
          auVar174._12_4_ = uVar1;
          auVar174._16_4_ = uVar1;
          auVar174._20_4_ = uVar1;
          auVar174._24_4_ = uVar1;
          auVar174._28_4_ = uVar1;
          uVar1 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
          auVar182._4_4_ = uVar1;
          auVar182._0_4_ = uVar1;
          auVar182._8_4_ = uVar1;
          auVar182._12_4_ = uVar1;
          auVar182._16_4_ = uVar1;
          auVar182._20_4_ = uVar1;
          auVar182._24_4_ = uVar1;
          auVar182._28_4_ = uVar1;
          uVar2 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
          auVar184._4_4_ = uVar2;
          auVar184._0_4_ = uVar2;
          auVar184._8_4_ = uVar2;
          auVar184._12_4_ = uVar2;
          auVar184._16_4_ = uVar2;
          auVar184._20_4_ = uVar2;
          auVar184._24_4_ = uVar2;
          auVar184._28_4_ = uVar2;
          fVar126 = (ray->super_RayK<1>).dir.field_0.m128[1];
          local_2700 = vsubps_avx(auVar141,auVar174);
          fVar131 = (ray->super_RayK<1>).dir.field_0.m128[2];
          auVar77 = vsubps_avx(auVar147,auVar182);
          auVar78 = vsubps_avx(auVar151,auVar184);
          fVar143 = auVar78._0_4_;
          fVar18 = auVar78._4_4_;
          auVar91._4_4_ = fVar126 * fVar18;
          auVar91._0_4_ = fVar126 * fVar143;
          fVar28 = auVar78._8_4_;
          auVar91._8_4_ = fVar126 * fVar28;
          fVar38 = auVar78._12_4_;
          auVar91._12_4_ = fVar126 * fVar38;
          fVar48 = auVar78._16_4_;
          auVar91._16_4_ = fVar126 * fVar48;
          fVar58 = auVar78._20_4_;
          auVar91._20_4_ = fVar126 * fVar58;
          fVar68 = auVar78._24_4_;
          auVar91._24_4_ = fVar126 * fVar68;
          auVar91._28_4_ = uVar1;
          fVar130 = auVar77._0_4_;
          fVar19 = auVar77._4_4_;
          auVar92._4_4_ = fVar131 * fVar19;
          auVar92._0_4_ = fVar131 * fVar130;
          fVar29 = auVar77._8_4_;
          auVar92._8_4_ = fVar131 * fVar29;
          fVar39 = auVar77._12_4_;
          auVar92._12_4_ = fVar131 * fVar39;
          fVar49 = auVar77._16_4_;
          auVar92._16_4_ = fVar131 * fVar49;
          fVar59 = auVar77._20_4_;
          auVar92._20_4_ = fVar131 * fVar59;
          fVar69 = auVar77._24_4_;
          auVar92._24_4_ = fVar131 * fVar69;
          auVar92._28_4_ = uVar2;
          auVar77 = vsubps_avx(auVar92,auVar91);
          fVar132 = (ray->super_RayK<1>).dir.field_0.m128[0];
          fVar10 = local_2700._0_4_;
          fVar20 = local_2700._4_4_;
          auVar93._4_4_ = fVar131 * fVar20;
          auVar93._0_4_ = fVar131 * fVar10;
          fVar30 = local_2700._8_4_;
          auVar93._8_4_ = fVar131 * fVar30;
          fVar40 = local_2700._12_4_;
          auVar93._12_4_ = fVar131 * fVar40;
          fVar50 = local_2700._16_4_;
          auVar93._16_4_ = fVar131 * fVar50;
          fVar60 = local_2700._20_4_;
          auVar93._20_4_ = fVar131 * fVar60;
          fVar70 = local_2700._24_4_;
          auVar93._24_4_ = fVar131 * fVar70;
          auVar93._28_4_ = local_2740._28_4_;
          auVar94._4_4_ = fVar132 * fVar18;
          auVar94._0_4_ = fVar132 * fVar143;
          auVar94._8_4_ = fVar132 * fVar28;
          auVar94._12_4_ = fVar132 * fVar38;
          auVar94._16_4_ = fVar132 * fVar48;
          auVar94._20_4_ = fVar132 * fVar58;
          auVar94._24_4_ = fVar132 * fVar68;
          auVar94._28_4_ = uVar85;
          auVar78 = vsubps_avx(auVar94,auVar93);
          auVar95._4_4_ = fVar132 * fVar19;
          auVar95._0_4_ = fVar132 * fVar130;
          auVar95._8_4_ = fVar132 * fVar29;
          auVar95._12_4_ = fVar132 * fVar39;
          auVar95._16_4_ = fVar132 * fVar49;
          auVar95._20_4_ = fVar132 * fVar59;
          auVar95._24_4_ = fVar132 * fVar69;
          auVar95._28_4_ = uVar85;
          auVar96._4_4_ = fVar126 * fVar20;
          auVar96._0_4_ = fVar126 * fVar10;
          auVar96._8_4_ = fVar126 * fVar30;
          auVar96._12_4_ = fVar126 * fVar40;
          auVar96._16_4_ = fVar126 * fVar50;
          auVar96._20_4_ = fVar126 * fVar60;
          auVar96._24_4_ = fVar126 * fVar70;
          auVar96._28_4_ = local_2700._28_4_;
          auVar79 = vsubps_avx(auVar96,auVar95);
          fVar11 = local_2760._0_4_;
          fVar21 = local_2760._4_4_;
          fVar31 = local_2760._8_4_;
          fVar41 = local_2760._12_4_;
          fVar51 = local_2760._16_4_;
          fVar61 = local_2760._20_4_;
          fVar71 = local_2760._24_4_;
          fVar12 = auVar120._0_4_;
          fVar22 = auVar120._4_4_;
          fVar32 = auVar120._8_4_;
          fVar42 = auVar120._12_4_;
          fVar52 = auVar120._16_4_;
          fVar62 = auVar120._20_4_;
          fVar72 = auVar120._24_4_;
          fVar13 = local_2740._0_4_;
          fVar23 = local_2740._4_4_;
          fVar33 = local_2740._8_4_;
          fVar43 = local_2740._12_4_;
          fVar53 = local_2740._16_4_;
          fVar63 = local_2740._20_4_;
          fVar73 = local_2740._24_4_;
          auVar129._0_4_ = fVar132 * fVar13 + fVar126 * fVar12 + fVar131 * fVar11;
          auVar129._4_4_ = fVar132 * fVar23 + fVar126 * fVar22 + fVar131 * fVar21;
          auVar129._8_4_ = fVar132 * fVar33 + fVar126 * fVar32 + fVar131 * fVar31;
          auVar129._12_4_ = fVar132 * fVar43 + fVar126 * fVar42 + fVar131 * fVar41;
          auVar129._16_4_ = fVar132 * fVar53 + fVar126 * fVar52 + fVar131 * fVar51;
          auVar129._20_4_ = fVar132 * fVar63 + fVar126 * fVar62 + fVar131 * fVar61;
          auVar129._24_4_ = fVar132 * fVar73 + fVar126 * fVar72 + fVar131 * fVar71;
          auVar129._28_4_ = fVar131 + fVar131 + local_2700._28_4_;
          auVar122._8_4_ = 0x80000000;
          auVar122._0_8_ = 0x8000000080000000;
          auVar122._12_4_ = 0x80000000;
          auVar122._16_4_ = 0x80000000;
          auVar122._20_4_ = 0x80000000;
          auVar122._24_4_ = 0x80000000;
          auVar122._28_4_ = 0x80000000;
          auVar120 = vandps_avx(auVar129,auVar122);
          uVar100 = auVar120._0_4_;
          auVar149._0_4_ =
               (float)(uVar100 ^
                      (uint)(fVar135 * auVar77._0_4_ +
                            fVar134 * auVar78._0_4_ + fVar133 * auVar79._0_4_));
          uVar164 = auVar120._4_4_;
          auVar149._4_4_ =
               (float)(uVar164 ^
                      (uint)(fVar16 * auVar77._4_4_ +
                            fVar15 * auVar78._4_4_ + fVar14 * auVar79._4_4_));
          uVar103 = auVar120._8_4_;
          auVar149._8_4_ =
               (float)(uVar103 ^
                      (uint)(fVar26 * auVar77._8_4_ +
                            fVar25 * auVar78._8_4_ + fVar24 * auVar79._8_4_));
          uVar165 = auVar120._12_4_;
          auVar149._12_4_ =
               (float)(uVar165 ^
                      (uint)(fVar36 * auVar77._12_4_ +
                            fVar35 * auVar78._12_4_ + fVar34 * auVar79._12_4_));
          uVar166 = auVar120._16_4_;
          auVar149._16_4_ =
               (float)(uVar166 ^
                      (uint)(fVar46 * auVar77._16_4_ +
                            fVar45 * auVar78._16_4_ + fVar44 * auVar79._16_4_));
          uVar167 = auVar120._20_4_;
          auVar149._20_4_ =
               (float)(uVar167 ^
                      (uint)(fVar56 * auVar77._20_4_ +
                            fVar55 * auVar78._20_4_ + fVar54 * auVar79._20_4_));
          uVar168 = auVar120._24_4_;
          auVar149._24_4_ =
               (float)(uVar168 ^
                      (uint)(fVar66 * auVar77._24_4_ +
                            fVar65 * auVar78._24_4_ + fVar64 * auVar79._24_4_));
          uVar169 = auVar120._28_4_;
          auVar149._28_4_ =
               (float)(uVar169 ^ (uint)(auVar139._28_4_ + auVar75._28_4_ + auVar76._28_4_));
          auVar154._0_4_ =
               (float)(uVar100 ^
                      (uint)(auVar77._0_4_ * fVar142 +
                            auVar78._0_4_ * fVar173 + fVar153 * auVar79._0_4_));
          auVar154._4_4_ =
               (float)(uVar164 ^
                      (uint)(auVar77._4_4_ * fVar17 +
                            auVar78._4_4_ * fVar176 + fVar156 * auVar79._4_4_));
          auVar154._8_4_ =
               (float)(uVar103 ^
                      (uint)(auVar77._8_4_ * fVar27 +
                            auVar78._8_4_ * fVar177 + fVar157 * auVar79._8_4_));
          auVar154._12_4_ =
               (float)(uVar165 ^
                      (uint)(auVar77._12_4_ * fVar37 +
                            auVar78._12_4_ * fVar178 + fVar158 * auVar79._12_4_));
          auVar154._16_4_ =
               (float)(uVar166 ^
                      (uint)(auVar77._16_4_ * fVar47 +
                            auVar78._16_4_ * fVar179 + fVar159 * auVar79._16_4_));
          auVar154._20_4_ =
               (float)(uVar167 ^
                      (uint)(auVar77._20_4_ * fVar57 +
                            auVar78._20_4_ * fVar180 + fVar160 * auVar79._20_4_));
          auVar154._24_4_ =
               (float)(uVar168 ^
                      (uint)(auVar77._24_4_ * fVar67 +
                            auVar78._24_4_ * fVar181 + fVar161 * auVar79._24_4_));
          auVar154._28_4_ = (float)(uVar169 ^ (uint)(auVar78._28_4_ + auVar79._28_4_ + -0.0));
          auVar139 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar120 = vcmpps_avx(auVar149,auVar139,5);
          auVar139 = vcmpps_avx(auVar154,auVar139,5);
          auVar120 = vandps_avx(auVar120,auVar139);
          auVar123._8_4_ = 0x7fffffff;
          auVar123._0_8_ = 0x7fffffff7fffffff;
          auVar123._12_4_ = 0x7fffffff;
          auVar123._16_4_ = 0x7fffffff;
          auVar123._20_4_ = 0x7fffffff;
          auVar123._24_4_ = 0x7fffffff;
          auVar123._28_4_ = 0x7fffffff;
          local_2600 = vandps_avx(auVar129,auVar123);
          auVar139 = vcmpps_avx(ZEXT1232(ZEXT412(0)) << 0x20,auVar129,4);
          auVar120 = vandps_avx(auVar120,auVar139);
          auVar124._0_4_ = auVar154._0_4_ + auVar149._0_4_;
          auVar124._4_4_ = auVar154._4_4_ + auVar149._4_4_;
          auVar124._8_4_ = auVar154._8_4_ + auVar149._8_4_;
          auVar124._12_4_ = auVar154._12_4_ + auVar149._12_4_;
          auVar124._16_4_ = auVar154._16_4_ + auVar149._16_4_;
          auVar124._20_4_ = auVar154._20_4_ + auVar149._20_4_;
          auVar124._24_4_ = auVar154._24_4_ + auVar149._24_4_;
          auVar124._28_4_ = auVar154._28_4_ + auVar149._28_4_;
          auVar75 = vcmpps_avx(auVar124,local_2600,2);
          auVar139 = vandps_avx(auVar120,auVar75);
          auVar76 = local_26a0 & auVar139;
          local_26e0._0_8_ = lVar105;
          if ((((((((auVar76 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar76 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar76 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar76 >> 0x7f,0) != '\0') ||
                (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar76 >> 0xbf,0) != '\0') ||
              (auVar76 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar76[0x1f] < '\0') {
            auVar139 = vandps_avx(auVar139,local_26a0);
            local_2620._0_4_ =
                 (float)(uVar100 ^ (uint)(fVar13 * fVar10 + fVar12 * fVar130 + fVar143 * fVar11));
            local_2620._4_4_ =
                 (float)(uVar164 ^ (uint)(fVar23 * fVar20 + fVar22 * fVar19 + fVar18 * fVar21));
            local_2620._8_4_ =
                 (float)(uVar103 ^ (uint)(fVar33 * fVar30 + fVar32 * fVar29 + fVar28 * fVar31));
            local_2620._12_4_ =
                 (float)(uVar165 ^ (uint)(fVar43 * fVar40 + fVar42 * fVar39 + fVar38 * fVar41));
            local_2620._16_4_ =
                 (float)(uVar166 ^ (uint)(fVar53 * fVar50 + fVar52 * fVar49 + fVar48 * fVar51));
            local_2620._20_4_ =
                 (float)(uVar167 ^ (uint)(fVar63 * fVar60 + fVar62 * fVar59 + fVar58 * fVar61));
            local_2620._24_4_ =
                 (float)(uVar168 ^ (uint)(fVar73 * fVar70 + fVar72 * fVar69 + fVar68 * fVar71));
            local_2620._28_4_ = uVar169 ^ (uint)(auVar75._28_4_ + auVar75._28_4_ + auVar120._28_4_);
            fVar126 = (ray->super_RayK<1>).org.field_0.m128[3];
            fVar131 = local_2600._0_4_;
            fVar132 = local_2600._4_4_;
            auVar97._4_4_ = fVar132 * fVar126;
            auVar97._0_4_ = fVar131 * fVar126;
            fVar133 = local_2600._8_4_;
            auVar97._8_4_ = fVar133 * fVar126;
            fVar134 = local_2600._12_4_;
            auVar97._12_4_ = fVar134 * fVar126;
            fVar135 = local_2600._16_4_;
            auVar97._16_4_ = fVar135 * fVar126;
            fVar142 = local_2600._20_4_;
            auVar97._20_4_ = fVar142 * fVar126;
            fVar143 = local_2600._24_4_;
            auVar97._24_4_ = fVar143 * fVar126;
            auVar97._28_4_ = fVar126;
            auVar120 = vcmpps_avx(auVar97,local_2620,1);
            fVar126 = (ray->super_RayK<1>).tfar;
            auVar98._4_4_ = fVar132 * fVar126;
            auVar98._0_4_ = fVar131 * fVar126;
            auVar98._8_4_ = fVar133 * fVar126;
            auVar98._12_4_ = fVar134 * fVar126;
            auVar98._16_4_ = fVar135 * fVar126;
            auVar98._20_4_ = fVar142 * fVar126;
            auVar98._24_4_ = fVar143 * fVar126;
            auVar98._28_4_ = fVar126;
            auVar75 = vcmpps_avx(local_2620,auVar98,2);
            auVar120 = vandps_avx(auVar75,auVar120);
            auVar75 = auVar139 & auVar120;
            if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0x7f,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar75 >> 0xbf,0) != '\0') ||
                (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar75[0x1f] < '\0') {
              local_2800._0_8_ = pSVar108;
              local_26e0._8_24_ = auVar74._8_24_;
              auVar75 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
              auVar152 = ZEXT3264(auVar75);
              auVar120 = vandps_avx(auVar139,auVar120);
              auVar139 = vsubps_avx(local_2600,auVar154);
              local_2660 = vblendvps_avx(auVar149,auVar139,local_24c0);
              local_25c0 = auVar120;
              auVar139 = vsubps_avx(local_2600,auVar149);
              local_2640 = vblendvps_avx(auVar154,auVar139,local_24c0);
              uStack_2524 = local_24c0._28_4_;
              local_2540[0] = fVar13 * (float)local_24e0._0_4_;
              local_2540[1] = fVar23 * (float)local_24e0._4_4_;
              local_2540[2] = fVar33 * fStack_24d8;
              local_2540[3] = fVar43 * fStack_24d4;
              fStack_2530 = fVar53 * fStack_24d0;
              fStack_252c = fVar63 * fStack_24cc;
              fStack_2528 = fVar73 * fStack_24c8;
              local_2520[0] = fVar12 * (float)local_24e0._0_4_;
              local_2520[1] = fVar22 * (float)local_24e0._4_4_;
              local_2520[2] = fVar32 * fStack_24d8;
              local_2520[3] = fVar42 * fStack_24d4;
              fStack_2510 = fVar52 * fStack_24d0;
              fStack_250c = fVar62 * fStack_24cc;
              fStack_2508 = fVar72 * fStack_24c8;
              uStack_2504 = uStack_2524;
              local_2500[0] = (float)local_24e0._0_4_ * fVar11;
              local_2500[1] = (float)local_24e0._4_4_ * fVar21;
              local_2500[2] = fStack_24d8 * fVar31;
              local_2500[3] = fStack_24d4 * fVar41;
              fStack_24f0 = fStack_24d0 * fVar51;
              fStack_24ec = fStack_24cc * fVar61;
              fStack_24e8 = fStack_24c8 * fVar71;
              uStack_24e4 = uStack_2524;
              local_2720 = auVar120;
              auVar139 = vrcpps_avx(local_2600);
              fVar126 = auVar139._0_4_;
              fVar130 = auVar139._4_4_;
              auVar99._4_4_ = fVar132 * fVar130;
              auVar99._0_4_ = fVar131 * fVar126;
              fVar131 = auVar139._8_4_;
              auVar99._8_4_ = fVar133 * fVar131;
              fVar132 = auVar139._12_4_;
              auVar99._12_4_ = fVar134 * fVar132;
              fVar133 = auVar139._16_4_;
              auVar99._16_4_ = fVar135 * fVar133;
              fVar134 = auVar139._20_4_;
              auVar99._20_4_ = fVar142 * fVar134;
              fVar135 = auVar139._24_4_;
              auVar99._24_4_ = fVar143 * fVar135;
              auVar99._28_4_ = local_2600._28_4_;
              auVar150._8_4_ = 0x3f800000;
              auVar150._0_8_ = 0x3f8000003f800000;
              auVar150._12_4_ = 0x3f800000;
              auVar150._16_4_ = 0x3f800000;
              auVar150._20_4_ = 0x3f800000;
              auVar150._24_4_ = 0x3f800000;
              auVar150._28_4_ = 0x3f800000;
              auVar139 = vsubps_avx(auVar150,auVar99);
              fVar126 = fVar126 + fVar126 * auVar139._0_4_;
              fVar130 = fVar130 + fVar130 * auVar139._4_4_;
              fVar131 = fVar131 + fVar131 * auVar139._8_4_;
              fVar132 = fVar132 + fVar132 * auVar139._12_4_;
              fVar133 = fVar133 + fVar133 * auVar139._16_4_;
              fVar134 = fVar134 + fVar134 * auVar139._20_4_;
              fVar135 = fVar135 + fVar135 * auVar139._24_4_;
              local_2560._4_4_ = fVar130 * local_2620._4_4_;
              local_2560._0_4_ = fVar126 * local_2620._0_4_;
              local_2560._8_4_ = fVar131 * local_2620._8_4_;
              local_2560._12_4_ = fVar132 * local_2620._12_4_;
              local_2560._16_4_ = fVar133 * local_2620._16_4_;
              local_2560._20_4_ = fVar134 * local_2620._20_4_;
              local_2560._24_4_ = fVar135 * local_2620._24_4_;
              local_2560._28_4_ = auVar139._28_4_;
              auVar117 = ZEXT3264(local_2560);
              local_25a0[0] = local_2660._0_4_ * fVar126;
              local_25a0[1] = local_2660._4_4_ * fVar130;
              local_25a0[2] = local_2660._8_4_ * fVar131;
              local_25a0[3] = local_2660._12_4_ * fVar132;
              fStack_2590 = local_2660._16_4_ * fVar133;
              fStack_258c = local_2660._20_4_ * fVar134;
              fStack_2588 = local_2660._24_4_ * fVar135;
              uStack_2584 = local_2660._28_4_;
              local_2580[0] = local_2640._0_4_ * fVar126;
              local_2580[1] = local_2640._4_4_ * fVar130;
              local_2580[2] = local_2640._8_4_ * fVar131;
              local_2580[3] = local_2640._12_4_ * fVar132;
              fStack_2570 = local_2640._16_4_ * fVar133;
              fStack_256c = local_2640._20_4_ * fVar134;
              fStack_2568 = local_2640._24_4_ * fVar135;
              uStack_2564 = local_2660._28_4_;
              auVar115._8_4_ = 0x7f800000;
              auVar115._0_8_ = 0x7f8000007f800000;
              auVar115._12_4_ = 0x7f800000;
              auVar115._16_4_ = 0x7f800000;
              auVar115._20_4_ = 0x7f800000;
              auVar115._24_4_ = 0x7f800000;
              auVar115._28_4_ = 0x7f800000;
              auVar139 = vblendvps_avx(auVar115,local_2560,auVar120);
              auVar74 = vshufps_avx(auVar139,auVar139,0xb1);
              auVar74 = vminps_avx(auVar139,auVar74);
              auVar76 = vshufpd_avx(auVar74,auVar74,5);
              auVar74 = vminps_avx(auVar74,auVar76);
              auVar76 = vperm2f128_avx(auVar74,auVar74,1);
              auVar74 = vminps_avx(auVar74,auVar76);
              auVar139 = vcmpps_avx(auVar139,auVar74,0);
              auVar74 = auVar120 & auVar139;
              if ((((((((auVar74 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar74 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar74 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar74 >> 0x7f,0) != '\0') ||
                    (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar74 >> 0xbf,0) != '\0') ||
                  (auVar74 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar74[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar139,auVar120);
              }
              uVar100 = vextractps_avx(auVar75._0_16_,1);
              uVar103 = vmovmskps_avx(auVar120);
              uVar164 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar164 & 1) == 0; uVar164 = uVar164 + 1) {
                }
              }
LAB_00e66d8b:
              local_27d0 = (ulong)uVar164;
              local_2778 = *(uint *)((long)&local_23c0 + local_27d0 * 4);
              local_27d8 = (pSVar108->geometries).items[local_2778].ptr;
              if ((local_27d8->mask & uVar100) == 0) {
                *(undefined4 *)(local_2720 + local_27d0 * 4) = 0;
              }
              else {
                local_26c0 = auVar152._0_32_;
                local_2700 = auVar117._0_32_;
                if (local_2808->args->filter == (RTCFilterFunctionN)0x0) {
                  local_27c0.context = local_2808->user;
                  if (local_27d8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    fVar126 = local_25a0[local_27d0];
                    fVar131 = local_2580[local_27d0];
                    (ray->super_RayK<1>).tfar = local_2540[local_27d0 - 8];
                    (ray->Ng).field_0.field_0.x = local_2540[local_27d0];
                    (ray->Ng).field_0.field_0.y = local_2520[local_27d0];
                    (ray->Ng).field_0.field_0.z = local_2500[local_27d0];
                    ray->u = fVar126;
                    ray->v = fVar131;
                    ray->primID = *(uint *)((long)&local_2680 + local_27d0 * 4);
                    ray->geomID = local_2778;
                    ray->instID[0] = (local_27c0.context)->instID[0];
                    ray->instPrimID[0] = (local_27c0.context)->instPrimID[0];
                    goto LAB_00e66ba8;
                  }
                }
                else {
                  local_27c0.context = local_2808->user;
                }
                local_2740._0_8_ = local_2808->args;
                local_2760._0_8_ = uVar110;
                local_2790 = local_2540[local_27d0];
                local_278c = local_2520[local_27d0];
                local_2788 = local_2500[local_27d0];
                local_2784 = local_25a0[local_27d0];
                local_2780 = local_2580[local_27d0];
                local_277c = *(undefined4 *)((long)&local_2680 + local_27d0 * 4);
                local_2774 = (local_27c0.context)->instID[0];
                local_2770 = (local_27c0.context)->instPrimID[0];
                (ray->super_RayK<1>).tfar = local_2540[local_27d0 - 8];
                local_280c = -1;
                local_27c0.valid = &local_280c;
                local_27c0.geometryUserPtr = local_27d8->userPtr;
                local_27c0.ray = (RTCRayN *)ray;
                local_27c0.hit = (RTCHitN *)&local_2790;
                local_27c0.N = 1;
                if ((local_27d8->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                   ((*local_27d8->intersectionFilterN)(&local_27c0), *local_27c0.valid != 0)) {
                  if ((*(code **)(local_2740._0_8_ + 0x10) != (code *)0x0) &&
                     ((((*(byte *)local_2740._0_8_ & 2) != 0 ||
                       (((local_27d8->field_8).field_0x2 & 0x40) != 0)) &&
                      ((**(code **)(local_2740._0_8_ + 0x10))(&local_27c0), *local_27c0.valid == 0))
                     )) goto LAB_00e67026;
                  (((Vec3f *)((long)local_27c0.ray + 0x30))->field_0).field_0.x =
                       *(float *)local_27c0.hit;
                  (((Vec3f *)((long)local_27c0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_27c0.hit + 4);
                  (((Vec3f *)((long)local_27c0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_27c0.hit + 8);
                  *(float *)((long)local_27c0.ray + 0x3c) = *(float *)(local_27c0.hit + 0xc);
                  *(float *)((long)local_27c0.ray + 0x40) = *(float *)(local_27c0.hit + 0x10);
                  *(float *)((long)local_27c0.ray + 0x44) = *(float *)(local_27c0.hit + 0x14);
                  *(float *)((long)local_27c0.ray + 0x48) = *(float *)(local_27c0.hit + 0x18);
                  *(float *)((long)local_27c0.ray + 0x4c) = *(float *)(local_27c0.hit + 0x1c);
                  *(float *)((long)local_27c0.ray + 0x50) = *(float *)(local_27c0.hit + 0x20);
                }
                else {
LAB_00e67026:
                  (ray->super_RayK<1>).tfar = (float)local_26c0._0_4_;
                }
                *(undefined4 *)(local_2720 + local_27d0 * 4) = 0;
                fVar126 = (ray->super_RayK<1>).tfar;
                auVar116._4_4_ = fVar126;
                auVar116._0_4_ = fVar126;
                auVar116._8_4_ = fVar126;
                auVar116._12_4_ = fVar126;
                auVar116._16_4_ = fVar126;
                auVar116._20_4_ = fVar126;
                auVar116._24_4_ = fVar126;
                auVar116._28_4_ = fVar126;
                auVar117 = ZEXT3264(local_2700);
                auVar120 = vcmpps_avx(local_2700,auVar116,2);
                local_2720 = vandps_avx(auVar120,local_2720);
                uVar100 = (ray->super_RayK<1>).mask;
                auVar152 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
                pSVar108 = (Scene *)local_2800._0_8_;
                uVar110 = local_2760._0_8_;
              }
              if ((((((((local_2720 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2720 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2720 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2720 >> 0x7f,0) == '\0') &&
                    (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2720 >> 0xbf,0) == '\0') &&
                  (local_2720 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2720[0x1f]) goto LAB_00e66ba8;
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar120 = vblendvps_avx(auVar125,auVar117._0_32_,local_2720);
              auVar139 = vshufps_avx(auVar120,auVar120,0xb1);
              auVar139 = vminps_avx(auVar120,auVar139);
              auVar75 = vshufpd_avx(auVar139,auVar139,5);
              auVar139 = vminps_avx(auVar139,auVar75);
              auVar75 = vperm2f128_avx(auVar139,auVar139,1);
              auVar139 = vminps_avx(auVar139,auVar75);
              auVar139 = vcmpps_avx(auVar120,auVar139,0);
              auVar75 = local_2720 & auVar139;
              auVar120 = local_2720;
              if ((((((((auVar75 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar75 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar75 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar75 >> 0x7f,0) != '\0') ||
                    (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar75 >> 0xbf,0) != '\0') ||
                  (auVar75 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar75[0x1f] < '\0') {
                auVar120 = vandps_avx(auVar139,local_2720);
              }
              uVar103 = vmovmskps_avx(auVar120);
              uVar164 = 0;
              if (uVar103 != 0) {
                for (; (uVar103 >> uVar164 & 1) == 0; uVar164 = uVar164 + 1) {
                }
              }
              goto LAB_00e66d8b;
            }
          }
LAB_00e66ba8:
          auVar152 = ZEXT3264(local_23e0);
          auVar155 = ZEXT3264(local_2400);
          auVar163 = ZEXT3264(local_2420);
          auVar171 = ZEXT3264(local_2440);
          auVar172 = ZEXT3264(local_2460);
          auVar175 = ZEXT3264(local_2480);
          auVar183 = ZEXT3264(local_24a0);
          lVar105 = local_26e0._0_8_ + 1;
        }
        fVar126 = (ray->super_RayK<1>).tfar;
        auVar117 = ZEXT3264(CONCAT428(fVar126,CONCAT424(fVar126,CONCAT420(fVar126,CONCAT416(fVar126,
                                                  CONCAT412(fVar126,CONCAT48(fVar126,CONCAT44(
                                                  fVar126,fVar126))))))));
      }
      goto LAB_00e664ce;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }